

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeSCP.cpp
# Opt level: O1

int __thiscall
FormatTypeSCP::LoadDisk
          (FormatTypeSCP *this,char *file_path,IDisk **created_disk,
          ILoadingProgress *loading_progress)

{
  int iVar1;
  FILE *__stream;
  ulong uVar2;
  void *__ptr;
  size_t sVar3;
  
  __stream = fopen(file_path,"rb");
  if (__stream == (FILE *)0x0) {
    iVar1 = -1;
  }
  else {
    fseek(__stream,0,2);
    uVar2 = ftell(__stream);
    rewind(__stream);
    uVar2 = uVar2 & 0xffffffff;
    __ptr = operator_new__(uVar2);
    sVar3 = fread(__ptr,1,uVar2,__stream);
    iVar1 = -1;
    if (sVar3 == uVar2) {
      iVar1 = (*(this->super_FormatType)._vptr_FormatType[8])
                        (this,__ptr,uVar2,created_disk,loading_progress);
    }
    operator_delete__(__ptr);
    fclose(__stream);
  }
  return iVar1;
}

Assistant:

int FormatTypeSCP::LoadDisk(const char* file_path, IDisk*& created_disk, ILoadingProgress* loading_progress)
{
   int return_value = -1;
   FILE* file;

   if (fopen_s(&file, file_path, "rb") == 0)
   {
      // Read whole file
      fseek(file, 0, SEEK_END);
      unsigned int size = ftell(file);
      rewind(file);
      unsigned char* buffer = new unsigned char[size];
      if (fread(buffer, 1, size, file) == size)
      {
         return_value = LoadDisk(buffer, size, created_disk, loading_progress);
      }
      else
      {
         return_value = FILE_ERROR;
      }
      delete[]buffer;

      fclose(file);
   }
   else
   {
      // Erreur : File not found
      return_value = FILE_ERROR;
   }
   return return_value;
}